

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsModel::addBaseLink(KinematicsModel *this,KinematicLink *baseLink)

{
  value_type *in_RDI;
  vector<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
  *unaff_retaddr;
  
  std::vector<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>::
  push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addBaseLink( KinematicLink* baseLink ) { mBaseLinks.push_back(baseLink); }